

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte *pbVar1;
  sqlite3 *db;
  sqlite3_xauth p_Var2;
  FKey *pFVar3;
  TriggerStep *pTVar4;
  int iVar5;
  uchar *zDatabase;
  uchar *zSql;
  uchar *zName;
  uchar *zNew;
  i64 iVar6;
  SrcList *pSVar7;
  char *pcVar8;
  long lVar9;
  TriggerStep **ppTVar10;
  int i;
  uint uVar11;
  long lVar12;
  RenameCtx sCtx;
  Walker local_238;
  Parse sParse;
  NameContext local_68;
  
  db = context->pOut->db;
  zDatabase = sqlite3_value_text(*argv);
  zSql = sqlite3_value_text(argv[3]);
  zName = sqlite3_value_text(argv[4]);
  zNew = sqlite3_value_text(argv[5]);
  iVar6 = sqlite3VdbeIntValue(argv[6]);
  if (zNew == (uchar *)0x0 || (zName == (uchar *)0x0 || zSql == (uchar *)0x0)) {
    return;
  }
  p_Var2 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  sqlite3BtreeEnterAll(db);
  sCtx.pTab = (Table *)0x0;
  sCtx.zOld = (char *)0x0;
  sCtx.pList = (RenameToken *)0x0;
  sCtx.nList = 0;
  sCtx.iCol = 0;
  sCtx.pTab = sqlite3FindTable(db,(char *)zName,(char *)zDatabase);
  local_238.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_238.walkerDepth = 0;
  local_238.eCode = 0;
  local_238._38_2_ = 0;
  local_238.xExprCallback = renameTableExprCb;
  local_238.xSelectCallback = renameTableSelectCb;
  local_238.pParse = &sParse;
  local_238.u.pNC = (NameContext *)&sCtx;
  iVar5 = renameParseSql(&sParse,(char *)zDatabase,db,(char *)zSql,(int)iVar6);
  if (iVar5 == 0) {
    uVar11 = (uint)db->flags;
    if (sParse.pNewTable == (Table *)0x0) {
      if (sParse.pNewIndex == (Index *)0x0) {
        pcVar8 = (sParse.pNewTrigger)->table;
        iVar5 = sqlite3_stricmp(pcVar8,(char *)zName);
        if ((iVar5 == 0) && ((sCtx.pTab)->pSchema == (sParse.pNewTrigger)->pTabSchema)) {
          renameTokenFind(&sParse,&sCtx,pcVar8);
        }
        if ((uVar11 >> 0x1a & 1) == 0) {
          iVar5 = renameResolveTrigger(&sParse);
          if (iVar5 != 0) goto LAB_001bb2ab;
          renameWalkTrigger(&local_238,sParse.pNewTrigger);
          ppTVar10 = &(sParse.pNewTrigger)->step_list;
          while (pTVar4 = *ppTVar10, pTVar4 != (TriggerStep *)0x0) {
            pcVar8 = pTVar4->zTarget;
            if ((pcVar8 != (char *)0x0) &&
               (iVar5 = sqlite3StrICmp(pcVar8,(char *)zName), iVar5 == 0)) {
              renameTokenFind(&sParse,&sCtx,pcVar8);
            }
            pSVar7 = pTVar4->pFrom;
            if (pSVar7 != (SrcList *)0x0) {
              lVar9 = 0x18;
              for (lVar12 = 0; lVar12 < pSVar7->nSrc; lVar12 = lVar12 + 1) {
                pcVar8 = *(char **)((long)pSVar7->a + lVar9 + -8);
                iVar5 = sqlite3_stricmp(pcVar8,(char *)zName);
                if (iVar5 == 0) {
                  renameTokenFind(&sParse,&sCtx,pcVar8);
                  pSVar7 = pTVar4->pFrom;
                }
                lVar9 = lVar9 + 0x68;
              }
            }
            ppTVar10 = &pTVar4->pNext;
          }
        }
      }
      else {
        renameTokenFind(&sParse,&sCtx,(sParse.pNewIndex)->zName);
        if ((uVar11 >> 0x1a & 1) == 0) {
          sqlite3WalkExpr(&local_238,(sParse.pNewIndex)->pPartIdxWhere);
        }
      }
    }
    else if ((sParse.pNewTable)->eTabType == '\x02') {
      if ((uVar11 >> 0x1a & 1) == 0) {
        local_68.ncFlags = 0;
        local_68._44_4_ = 0;
        local_68.pWinSelect = (Select *)0x0;
        local_68.pNext = (NameContext *)0x0;
        local_68.nRef = 0;
        local_68.nNcErr = 0;
        local_68.pSrcList = (SrcList *)0x0;
        local_68.uNC.pEList = (ExprList *)0x0;
        pbVar1 = (byte *)((long)&(((sParse.pNewTable)->u).view.pSelect)->selFlags + 2);
        *pbVar1 = *pbVar1 & 0xdf;
        local_68.pParse = &sParse;
        sqlite3SelectPrep(&sParse,((sParse.pNewTable)->u).view.pSelect,&local_68);
        if (sParse.nErr == 0) {
          sqlite3WalkSelect(&local_238,((sParse.pNewTable)->u).view.pSelect);
        }
        else {
          iVar5 = sParse.rc;
          if (sParse.rc != 0) goto LAB_001bb2ab;
        }
      }
    }
    else {
      if ((((byte)(db->flags >> 0x1a) & 0x3f & (uVar11 >> 0xe & 1) == 0) == 0) &&
         ((sParse.pNewTable)->eTabType != '\x01')) {
        pFVar3 = (FKey *)&(sParse.pNewTable)->u;
        while (pFVar3 = pFVar3->pNextFrom, pFVar3 != (FKey *)0x0) {
          pcVar8 = pFVar3->zTo;
          iVar5 = sqlite3_stricmp(pcVar8,(char *)zName);
          if (iVar5 == 0) {
            renameTokenFind(&sParse,&sCtx,pcVar8);
          }
        }
      }
      pcVar8 = (sParse.pNewTable)->zName;
      iVar5 = sqlite3_stricmp((char *)zName,pcVar8);
      if (iVar5 == 0) {
        sCtx.pTab = sParse.pNewTable;
        if ((uVar11 >> 0x1a & 1) == 0) {
          sqlite3WalkExprList(&local_238,(sParse.pNewTable)->pCheck);
          pcVar8 = (sParse.pNewTable)->zName;
        }
        renameTokenFind(&sParse,&sCtx,pcVar8);
      }
    }
    iVar5 = renameEditSql(context,&sCtx,(char *)zSql,(char *)zNew,1);
  }
LAB_001bb2ab:
  if (iVar5 != 0) {
    if ((iVar5 == 1) && ((db->flags & 0x10000001) == 1)) {
      sqlite3_result_value(context,argv[3]);
    }
    else if (sParse.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(context,iVar5);
    }
    else {
      renameColumnParseError(context,"",argv[1],argv[2],&sParse);
    }
  }
  renameParseCleanup(&sParse);
  renameTokenFree(db,sCtx.pList);
  sqlite3BtreeLeaveAll(db);
  db->xAuth = p_Var2;
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( IsView(pTab) ){
          if( isLegacy==0 ){
            Select *pSelect = pTab->u.view.pSelect;
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            assert( pSelect->selFlags & SF_View );
            pSelect->selFlags &= ~SF_View;
            sqlite3SelectPrep(&sParse, pTab->u.view.pSelect, &sNC);
            if( sParse.nErr ){
              rc = sParse.rc;
            }else{
              sqlite3WalkSelect(&sWalker, pTab->u.view.pSelect);
            }
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( (isLegacy==0 || (db->flags & SQLITE_ForeignKeys))
           && !IsVirtual(pTab)
          ){
            FKey *pFKey;
            assert( IsOrdinaryTable(pTab) );
            for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld)
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
              if( pStep->pFrom ){
                int i;
                for(i=0; i<pStep->pFrom->nSrc; i++){
                  SrcItem *pItem = &pStep->pFrom->a[i];
                  if( 0==sqlite3_stricmp(pItem->zName, zOld) ){
                    renameTokenFind(&sParse, &sCtx, pItem->zName);
                  }
                }
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_ERROR && sqlite3WritableSchema(db) ){
        sqlite3_result_value(context, argv[3]);
      }else if( sParse.zErrMsg ){
        renameColumnParseError(context, "", argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}